

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

int pcp_pulse(pcp_ctx_t *ctx,timeval *next_timeout)

{
  uint32_t uVar1;
  undefined4 uVar2;
  pcp_errno pVar3;
  int iVar4;
  uint32_t uVar5;
  pcp_recv_msg_t *msg_00;
  time_t tVar6;
  bool bVar7;
  bool local_9a;
  pcp_recv_msg_t *local_98;
  hserver_iter_data local_90;
  in6_addr *__a_1;
  in6_addr *__a;
  hserver_iter_data param;
  pcp_server_t *s;
  undefined1 local_48 [4];
  uint32_t scope_id;
  in6_addr ip6;
  timeval tmp_timeout;
  pcp_recv_msg_t *msg;
  timeval *next_timeout_local;
  pcp_ctx_t *ctx_local;
  
  memset((void *)((long)&ip6.__in6_u + 8),0,0x10);
  if (ctx == (pcp_ctx_t *)0x0) {
    return -8;
  }
  msg_00 = &ctx->msg;
  msg = (pcp_recv_msg_t *)next_timeout;
  if (next_timeout == (timeval *)0x0) {
    msg = (pcp_recv_msg_t *)((long)&ip6.__in6_u + 8);
  }
  memset(msg_00,1,0x578);
  pVar3 = read_msg(ctx,msg_00);
  if (pVar3 != PCP_ERR_SUCCESS) goto LAB_001068db;
  __a = (in6_addr *)0x0;
  param.res_timeout = (timeval *)0x2;
  tVar6 = time((time_t *)0x0);
  (ctx->msg).received_time = tVar6;
  iVar4 = validate_pcp_msg(msg_00);
  if ((iVar4 == 0) || (pVar3 = parse_response(msg_00), pVar3 != PCP_ERR_SUCCESS)) goto LAB_001068db;
  pcp_fill_in6_addr((in6_addr *)local_48,(uint16_t *)0x0,(uint32_t *)((long)&s + 4),
                    (sockaddr *)&(ctx->msg).rcvd_from_addr);
  param._8_8_ = get_pcp_server_by_ip(ctx,(in6_addr *)local_48,s._4_4_);
  if ((pcp_server_t *)param._8_8_ == (pcp_server_t *)0x0) goto LAB_001068db;
  (ctx->msg).pcp_server_indx = ((pcp_server_t *)param._8_8_)->index;
  *(undefined8 *)&(ctx->msg).kd.pcp_server_ip.__in6_u =
       *(undefined8 *)((pcp_server_t *)param._8_8_)->pcp_ip;
  *(undefined8 *)((long)&(ctx->msg).kd.pcp_server_ip.__in6_u + 8) =
       *(undefined8 *)(((pcp_server_t *)param._8_8_)->pcp_ip + 2);
  pcp_fill_in6_addr(&(ctx->msg).kd.src_ip,(uint16_t *)0x0,&(ctx->msg).kd.scope_id,
                    (sockaddr *)&(ctx->msg).rcvd_to_addr);
  bVar7 = false;
  if ((((ctx->msg).kd.src_ip.__in6_u.__u6_addr32[0] == 0) &&
      (bVar7 = false, (ctx->msg).kd.src_ip.__in6_u.__u6_addr32[1] == 0)) &&
     (bVar7 = false, (ctx->msg).kd.src_ip.__in6_u.__u6_addr32[2] == 0)) {
    bVar7 = (ctx->msg).kd.src_ip.__in6_u.__u6_addr32[3] == 0;
  }
  if (bVar7) {
LAB_00106882:
    *(undefined8 *)&(ctx->msg).kd.src_ip.__in6_u = *(undefined8 *)(param._8_8_ + 0x24);
    *(undefined8 *)((long)&(ctx->msg).kd.src_ip.__in6_u + 8) = *(undefined8 *)(param._8_8_ + 0x2c);
    (ctx->msg).kd.scope_id = s._4_4_;
  }
  else {
    local_9a = false;
    if (((ctx->msg).kd.src_ip.__in6_u.__u6_addr32[0] == 0) &&
       (local_9a = false, (ctx->msg).kd.src_ip.__in6_u.__u6_addr32[1] == 0)) {
      uVar1 = (ctx->msg).kd.src_ip.__in6_u.__u6_addr32[2];
      uVar5 = htonl(0xffff);
      local_9a = uVar1 == uVar5;
    }
    local_90._12_4_ = ZEXT14(local_9a);
    if (((local_90._12_4_ != 0) && ((ctx->msg).kd.src_ip.__in6_u.__u6_addr8[0xc] == '\0')) &&
       (((ctx->msg).kd.src_ip.__in6_u.__u6_addr8[0xd] == '\0' &&
        (((ctx->msg).kd.src_ip.__in6_u.__u6_addr8[0xe] == '\0' &&
         ((ctx->msg).kd.src_ip.__in6_u.__u6_addr8[0xf] == '\0')))))) goto LAB_00106882;
  }
  if ((ctx->msg).recv_version < 2) {
    *(undefined8 *)(ctx->msg).kd.nonce.n = *(undefined8 *)(param._8_8_ + 0x100);
    (ctx->msg).kd.nonce.n[2] = *(uint32_t *)(param._8_8_ + 0x108);
  }
  hserver_iter((pcp_server_t *)param._8_8_,&__a);
LAB_001068db:
  local_98 = msg;
  local_90.res_timeout._0_4_ = 1;
  pcp_db_foreach_server(ctx,hserver_iter,&local_98);
  uVar2 = msg->opt_flags;
  return uVar2 * 1000 + (int)(*(long *)&(msg->kd).src_ip.__in6_u / 1000);
}

Assistant:

int pcp_pulse(pcp_ctx_t *ctx, struct timeval *next_timeout) {
    pcp_recv_msg_t *msg;
    struct timeval tmp_timeout = {0, 0};

    if (!ctx) {
        return PCP_ERR_BAD_ARGS;
    }

    msg = &ctx->msg;

    if (!next_timeout) {
        next_timeout = &tmp_timeout;
    }

    memset(msg, 1, sizeof(*msg));

    if (read_msg(ctx, msg) == PCP_ERR_SUCCESS) {
        struct in6_addr ip6;
        uint32_t scope_id;
        pcp_server_t *s;
        struct hserver_iter_data param = {NULL, pcpe_io_event};

        msg->received_time = time(NULL);

        if (!validate_pcp_msg(msg)) {
            PCP_LOG(PCP_LOGLVL_PERR, "%s", "Invalid PCP msg");
            goto process_timeouts;
        }

        if ((parse_response(msg)) != PCP_ERR_SUCCESS) {
            PCP_LOG(PCP_LOGLVL_PERR, "%s", "Cannot parse PCP msg");
            goto process_timeouts;
        }

        pcp_fill_in6_addr(&ip6, NULL, &scope_id,
                          (struct sockaddr *)&msg->rcvd_from_addr);
        PCP_LOG(PCP_LOGLVL_DEBUG, "SCOPE_ID: %u", scope_id);
        s = get_pcp_server_by_ip(ctx, &ip6, scope_id);

        if (s) {
            PCP_LOG(PCP_LOGLVL_DEBUG, "Found server: %s", s->pcp_server_paddr);
            msg->pcp_server_indx = s->index;
            memcpy(&msg->kd.pcp_server_ip, s->pcp_ip, sizeof(struct in6_addr));
            pcp_fill_in6_addr(&msg->kd.src_ip, NULL, &msg->kd.scope_id,
                              (struct sockaddr *)&msg->rcvd_to_addr);
            if (IPV6_IS_ADDR_ANY(&msg->kd.src_ip)) {
                memcpy(&msg->kd.src_ip, s->src_ip, sizeof(struct in6_addr));
                msg->kd.scope_id = scope_id;
            }
            if (msg->recv_version < 2) {
                memcpy(&msg->kd.nonce, &s->nonce, sizeof(struct pcp_nonce));
            }

            // process pcpe_io_event for server
            hserver_iter(s, &param);
        }
    }

process_timeouts : {
    struct hserver_iter_data param = {next_timeout, pcpe_timeout};
    pcp_db_foreach_server(ctx, hserver_iter, &param);
}

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return (next_timeout->tv_sec * 1000) + (next_timeout->tv_usec / 1000);
}